

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ConversionError::ConversionError(ConversionError *this,string *member,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *name_local;
  string *member_local;
  ConversionError *this_local;
  
  local_20 = name;
  name_local = member;
  member_local = (string *)this;
  ::std::operator+(&local_80,"The value ",member);
  ::std::operator+(&local_60,&local_80," is not an allowed value for ");
  ::std::operator+(&local_40,&local_60,name);
  ConversionError(this,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

ConversionError(std::string member, std::string name)
        : ConversionError("The value " + member + " is not an allowed value for " + name) {}